

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

GCproto * lj_parse(LexState *ls)

{
  FuncScope *pFVar1;
  GCstr *pGVar2;
  GCproto *pGVar3;
  MSize *pMVar4;
  long in_RDI;
  lua_State *L;
  GCproto *pt;
  FuncScope bl;
  FuncState fs;
  FuncState *pFVar5;
  LexToken tok;
  FuncState *fs_00;
  undefined4 in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffc8c;
  BCIns ins;
  FuncState *fs_01;
  FuncScope local_360 [3];
  BCLine in_stack_fffffffffffffcd4;
  LexState *in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  
  pFVar5 = *(FuncState **)(in_RDI + 8);
  fs_00 = *(FuncState **)(in_RDI + 0x70);
  fs_01 = pFVar5;
  strlen(*(char **)(in_RDI + 0x70));
  tok = (LexToken)((ulong)pFVar5 >> 0x20);
  pGVar2 = lj_str_new((lua_State *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                      in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  *(GCstr **)(in_RDI + 0x68) = pGVar2;
  pFVar1 = fs_01->bl;
  *(int *)&pFVar1->prev = (int)*(undefined8 *)(in_RDI + 0x68);
  *(undefined4 *)((long)&pFVar1->prev + 4) = 0xfffffffb;
  pMVar4 = &fs_01->bl->vstart;
  fs_01->bl = (FuncScope *)pMVar4;
  ins = in_stack_fffffffffffffc8c & 0xffffff;
  if ((undefined1 *)(ulong)*(uint *)&fs_01->prev <= pMVar4) {
    lj_state_growstack1((lua_State *)0x14839b);
    ins = ins & 0xffffff;
  }
  *(undefined4 *)(in_RDI + 0x9c) = 0;
  fs_init((LexState *)CONCAT44(ins,in_stack_fffffffffffffc88),fs_00);
  fscope_begin((FuncState *)(local_360 + 1),local_360,0);
  bcemit_INS(fs_01,ins);
  lj_lex_next((LexState *)0x14842f);
  parse_chunk((LexState *)fs_00);
  if (*(int *)(in_RDI + 0x34) != 0x121) {
    err_token((LexState *)fs_00,tok);
  }
  pGVar3 = fs_finish(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
  fs_01->bl = (FuncScope *)&fs_01->bl[-1].vstart;
  return pGVar3;
}

Assistant:

GCproto *lj_parse(LexState *ls)
{
  FuncState fs;
  FuncScope bl;
  GCproto *pt;
  lua_State *L = ls->L;
#ifdef LUAJIT_DISABLE_DEBUGINFO
  ls->chunkname = lj_str_newlit(L, "=");
#else
  ls->chunkname = lj_str_newz(L, ls->chunkarg);
#endif
  setstrV(L, L->top, ls->chunkname);  /* Anchor chunkname string. */
  incr_top(L);
  ls->level = 0;
  fs_init(ls, &fs);
  fs.linedefined = 0;
  fs.numparams = 0;
  fs.bcbase = NULL;
  fs.bclim = 0;
  fs.flags |= PROTO_VARARG;  /* Main chunk is always a vararg func. */
  fscope_begin(&fs, &bl, 0);
  bcemit_AD(&fs, BC_FUNCV, 0, 0);  /* Placeholder. */
  lj_lex_next(ls);  /* Read-ahead first token. */
  parse_chunk(ls);
  if (ls->tok != TK_eof)
    err_token(ls, TK_eof);
  pt = fs_finish(ls, ls->linenumber);
  L->top--;  /* Drop chunkname. */
  lj_assertL(fs.prev == NULL && ls->fs == NULL, "mismatched frame nesting");
  lj_assertL(pt->sizeuv == 0, "toplevel proto has upvalues");
  return pt;
}